

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::scrollTo(QListView *this,QModelIndex *index,ScrollHint hint)

{
  QListViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QWidgetData *pQVar2;
  QRect QVar3;
  QRect QVar4;
  char cVar5;
  int iVar6;
  Flow FVar7;
  QScrollBar *pQVar8;
  long in_FS_OFFSET;
  QRect local_58;
  undefined1 local_48 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_48._0_4_ = -1;
    local_48._4_4_ = -1;
    local_48._8_8_ = 0;
    tStack_38.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(local_48,pQVar1,index);
  }
  cVar5 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).root,(QModelIndex *)local_48);
  QVar4.x2.m_i = local_48._8_4_;
  QVar4.y2.m_i = local_48._12_4_;
  QVar4.x1.m_i = local_48._0_4_;
  QVar4.y1.m_i = local_48._4_4_;
  QVar3.x2.m_i = local_48._8_4_;
  QVar3.y2.m_i = local_48._12_4_;
  QVar3.x1.m_i = local_48._0_4_;
  QVar3.y1.m_i = local_48._4_4_;
  if ((cVar5 != '\0') && (QVar3 = QVar4, index->c == this_00->column)) {
    local_48 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x1e0))(this,index);
    QVar3 = (QRect)local_48;
    if ((local_48._0_4_ <= local_48._8_4_) && (local_48._4_4_ <= local_48._12_4_)) {
      if (hint == EnsureVisible) {
        pQVar2 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        local_58.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
        local_58.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
        local_58.x1.m_i = 0;
        local_58.y1.m_i = 0;
        cVar5 = QRect::contains(&local_58,SUB81(local_48,0));
        if (cVar5 != '\0') {
          QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                          .viewport,(QRect *)local_48);
          QVar3 = (QRect)local_48;
          goto LAB_00568ca7;
        }
      }
      FVar7 = this_00->flow;
      if ((FVar7 == TopToBottom) || (this_00->wrap == true)) {
        pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar6 = QListViewPrivate::verticalScrollToValue(this_00,index,(QRect *)local_48,hint);
        QAbstractSlider::setValue(&pQVar8->super_QAbstractSlider,iVar6);
        FVar7 = this_00->flow;
      }
      if ((FVar7 == LeftToRight) || (QVar3 = (QRect)local_48, this_00->wrap == true)) {
        pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
        iVar6 = QListViewPrivate::horizontalScrollToValue(this_00,index,(QRect *)local_48,hint);
        QAbstractSlider::setValue(&pQVar8->super_QAbstractSlider,iVar6);
        QVar3 = (QRect)local_48;
      }
    }
  }
LAB_00568ca7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  local_48 = (undefined1  [16])QVar3;
  __stack_chk_fail();
}

Assistant:

void QListView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QListView);

    if (index.parent() != d->root || index.column() != d->column)
        return;

    const QRect rect = visualRect(index);
    if (!rect.isValid())
        return;
    if (hint == EnsureVisible && d->viewport->rect().contains(rect)) {
        d->viewport->update(rect);
        return;
    }

    if (d->flow == QListView::TopToBottom || d->isWrapping()) // vertical
        verticalScrollBar()->setValue(d->verticalScrollToValue(index, rect, hint));

    if (d->flow == QListView::LeftToRight || d->isWrapping()) // horizontal
        horizontalScrollBar()->setValue(d->horizontalScrollToValue(index, rect, hint));
}